

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O0

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::CovergroupBodySymbol>
          (ASTSerializer *this,CovergroupBodySymbol *elem,bool inMembersArray)

{
  bool bVar1;
  Compilation *this_00;
  Symbol *symbol;
  Symbol *member;
  iterator __end0_1;
  iterator __begin0_1;
  iterator_range<slang::ast::Scope::iterator> *__range8_1;
  AttributeSymbol *local_b8;
  AttributeSymbol *attr;
  iterator __end0;
  iterator __begin0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range8;
  undefined1 local_88 [8];
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  Scope *scope;
  char *local_68;
  string_view local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_t local_40;
  char *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined1 local_19;
  CovergroupBodySymbol *pCStack_18;
  bool inMembersArray_local;
  CovergroupBodySymbol *elem_local;
  ASTSerializer *this_local;
  
  local_19 = inMembersArray;
  pCStack_18 = elem;
  elem_local = (CovergroupBodySymbol *)this;
  JsonWriter::startObject(this->writer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"name");
  local_40 = (pCStack_18->super_Symbol).name._M_len;
  local_38 = (pCStack_18->super_Symbol).name._M_str;
  write(this,(int)local_30._M_len,local_30._M_str,local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"kind");
  local_60 = ast::toString((pCStack_18->super_Symbol).kind);
  write(this,(int)local_50._M_len,local_50._M_str,local_60._M_len);
  if ((this->includeAddrs & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&scope,"addr");
    write(this,(int)scope,local_68,(size_t)pCStack_18);
  }
  attributes.size_ = (size_type)Symbol::getParentScope(&pCStack_18->super_Symbol);
  if ((Scope *)attributes.size_ != (Scope *)0x0) {
    this_00 = Scope::getCompilation((Scope *)attributes.size_);
    _local_88 = Compilation::getAttributes(this_00,&pCStack_18->super_Symbol);
    bVar1 = nonstd::span_lite::
            span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                      ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                       local_88);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range8,"attributes");
      startArray(this,___range8);
      __begin0 = (iterator)local_88;
      __end0 = nonstd::span_lite::
               span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
                         ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                          __begin0);
      attr = (AttributeSymbol *)
             nonstd::span_lite::
             span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                        __begin0);
      for (; (AttributeSymbol *)__end0 != attr; __end0 = __end0 + 1) {
        local_b8 = *__end0;
        serialize(this,&local_b8->super_Symbol,false);
      }
      endArray(this);
    }
  }
  bVar1 = Scope::empty(&pCStack_18->super_Scope);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range8_1,"members");
    startArray(this,___range8_1);
    ___begin0_1 = Scope::members(&pCStack_18->super_Scope);
    __end0_1 = iterator_range<slang::ast::Scope::iterator>::begin
                         ((iterator_range<slang::ast::Scope::iterator> *)&__begin0_1);
    member = (Symbol *)
             iterator_range<slang::ast::Scope::iterator>::end
                       ((iterator_range<slang::ast::Scope::iterator> *)&__begin0_1);
    while (bVar1 = iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                   ::operator!=((iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                                 *)&__end0_1,(iterator *)&member), bVar1) {
      symbol = Scope::iterator::operator*(&__end0_1);
      serialize(this,symbol,true);
      Scope::iterator::operator++(&__end0_1);
    }
    endArray(this);
  }
  CovergroupBodySymbol::serializeTo(pCStack_18,this);
  JsonWriter::endObject(this->writer);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    // TODO: remove once we no longer support gcc-10
    (void)inMembersArray;

    if constexpr (std::is_base_of_v<Expression, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));
        write("type", *elem.type);

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        EvalContext ctx(compilation, EvalFlags::CacheResults);
        ConstantValue constant = elem.eval(ctx);
        if (constant)
            write("constant", constant);

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Type, T> && !std::is_same_v<TypeAliasType, T> &&
                       !std::is_same_v<ClassType, T> && !std::is_same_v<CovergroupType, T>) {
        writer.writeValue(elem.toString());
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            if (!inMembersArray) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::NotConst | MethodFlags::Randomize))
                return;
        }

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto scope = elem.getParentScope();
        if (scope) {
            auto attributes = scope->getCompilation().getAttributes(elem);
            if (!attributes.empty()) {
                startArray("attributes");
                for (auto attr : attributes)
                    serialize(*attr);
                endArray();
            }
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
}